

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O3

void __thiscall SpiAnalyzer::~SpiAnalyzer(SpiAnalyzer *this)

{
  pointer puVar1;
  SpiAnalyzerResults *pSVar2;
  SpiAnalyzerSettings *pSVar3;
  
  *(undefined ***)this = &PTR__SpiAnalyzer_0010cca0;
  Analyzer::KillThread();
  DataBuilder::~DataBuilder(&this->mMisoResult);
  DataBuilder::~DataBuilder(&this->mMosiResult);
  puVar1 = (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  SpiSimulationDataGenerator::~SpiSimulationDataGenerator(&this->mSimulationDataGenerator);
  pSVar2 = (this->mResults)._M_ptr;
  if (pSVar2 != (SpiAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar2 + 8))();
  }
  pSVar3 = (this->mSettings)._M_ptr;
  if (pSVar3 != (SpiAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pSVar3 + 8))();
  }
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

SpiAnalyzer::~SpiAnalyzer()
{
    KillThread();
}